

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

bool __thiscall ExecutorX86::SetStackSize(ExecutorX86 *this,uint bytes)

{
  bool bVar1;
  char *pcVar2;
  uint bytes_local;
  ExecutorX86 *this_local;
  
  if (((this->codeRunning & 1U) == 0) &&
     (bVar1 = FastVector<x86Instruction,_true,_true>::empty(&this->instList), bVar1)) {
    this->minStackSize = bytes;
    NULLC::AllowMemoryPageRead((this->vmState).dataStackEnd);
    (*(code *)NULLC::dealloc)((this->vmState).dataStackBase);
    pcVar2 = (char *)(*(code *)NULLC::alloc)(this->minStackSize + 0x2000);
    (this->vmState).dataStackBase = pcVar2;
    NULLC::fillMemory((this->vmState).dataStackBase,0,(ulong)this->minStackSize);
    (this->vmState).dataStackEnd = (this->vmState).dataStackBase + this->minStackSize;
    NULLC::DenyMemoryPageRead((this->vmState).dataStackEnd);
    return true;
  }
  return false;
}

Assistant:

bool ExecutorX86::SetStackSize(unsigned bytes)
{
	if(codeRunning || !instList.empty())
		return false;

	minStackSize = bytes;

	NULLC::AllowMemoryPageRead(vmState.dataStackEnd);

	NULLC::dealloc(vmState.dataStackBase);

	vmState.dataStackBase = (char*)NULLC::alloc(sizeof(char) * minStackSize + 8192); // Two extra pages for page guard
	NULLC::fillMemory(vmState.dataStackBase, 0, sizeof(char) * minStackSize);
	vmState.dataStackEnd = vmState.dataStackBase + minStackSize;

	NULLC::DenyMemoryPageRead(vmState.dataStackEnd);

	return true;
}